

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O1

CURLcode Curl_pp_readresp(Curl_easy *data,int sockindex,pingpong *pp,int *code,size_t *size)

{
  dynbuf *s;
  pingpong *ppVar1;
  CURLcode CVar2;
  _Bool _Var3;
  CURLcode CVar4;
  size_t sVar5;
  char *ptr;
  void *pvVar6;
  uint *puVar7;
  ulong size_00;
  int iVar8;
  ssize_t gotbytes;
  char buffer [900];
  size_t local_3e8;
  pingpong *local_3e0;
  int local_3d8;
  CURLcode local_3d4;
  size_t *local_3d0;
  connectdata *local_3c8;
  int *local_3c0;
  char local_3b8 [904];
  
  local_3c8 = data->conn;
  *code = 0;
  *size = 0;
  s = &pp->recvbuf;
  CVar4 = CURLE_OK;
  local_3e0 = pp;
  local_3d8 = sockindex;
  local_3d0 = size;
  local_3c0 = code;
  do {
    ppVar1 = local_3e0;
    local_3e8 = 0;
    if (local_3e0->nfinal != 0) {
      sVar5 = Curl_dyn_len(s);
      Curl_dyn_tail(s,sVar5 - ppVar1->nfinal);
      ppVar1->nfinal = 0;
    }
    if (ppVar1->overflow == 0) {
      CVar4 = Curl_conn_recv(data,local_3d8,local_3b8,900,(ssize_t *)&local_3e8);
      if (CVar4 != CURLE_OK) {
        if (CVar4 != CURLE_AGAIN) {
          return CVar4;
        }
        return CURLE_OK;
      }
      if ((long)local_3e8 < 1) {
        puVar7 = (uint *)__errno_location();
        Curl_failf(data,"response reading failed (errno: %d)",(ulong)*puVar7);
        return CURLE_RECV_ERROR;
      }
      CVar4 = Curl_dyn_addn(s,local_3b8,local_3e8);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      puVar7 = &(data->req).headerbytecount;
      *puVar7 = *puVar7 + (int)local_3e8;
      ppVar1->nread_resp = ppVar1->nread_resp + local_3e8;
      CVar4 = CURLE_OK;
    }
    do {
      ptr = Curl_dyn_ptr(s);
      sVar5 = Curl_dyn_len(s);
      pvVar6 = memchr(ptr,10,sVar5);
      if (pvVar6 == (void *)0x0) {
        local_3e0->overflow = 0;
LAB_0014aafe:
        iVar8 = 4;
        CVar2 = local_3d4;
      }
      else {
        size_00 = (long)pvVar6 + (1 - (long)ptr);
        iVar8 = 1;
        Curl_debug(data,CURLINFO_HEADER_IN,ptr,size_00);
        CVar4 = Curl_client_write(data,2,ptr,size_00);
        ppVar1 = local_3e0;
        CVar2 = CVar4;
        if (CVar4 == CURLE_OK) {
          _Var3 = (*local_3e0->endofresp)(data,local_3c8,ptr,size_00,local_3c0);
          if (_Var3) {
            ppVar1->nfinal = size_00;
            sVar5 = Curl_dyn_len(s);
            if (size_00 < sVar5) {
              sVar5 = Curl_dyn_len(s);
              sVar5 = sVar5 - size_00;
            }
            else {
              sVar5 = 0;
            }
            ppVar1->overflow = sVar5;
            *local_3d0 = ppVar1->nread_resp;
            ppVar1->nread_resp = 0;
            local_3e8 = 0;
            goto LAB_0014aafe;
          }
          sVar5 = Curl_dyn_len(s);
          if (size_00 < sVar5) {
            sVar5 = Curl_dyn_len(s);
            Curl_dyn_tail(s,sVar5 - size_00);
          }
          else {
            Curl_dyn_reset(s);
          }
          iVar8 = 0;
          CVar2 = local_3d4;
        }
      }
      local_3d4 = CVar2;
    } while (iVar8 == 0);
    if (iVar8 != 4) {
      return local_3d4;
    }
    if (local_3e8 != 900) {
      local_3e0->pending_resp = false;
      return CVar4;
    }
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(struct Curl_easy *data,
                          int sockindex,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  struct connectdata *conn = data->conn;
  CURLcode result = CURLE_OK;
  ssize_t gotbytes;
  char buffer[900];

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  do {
    gotbytes = 0;
    if(pp->nfinal) {
      /* a previous call left this many bytes in the beginning of the buffer as
         that was the final line; now ditch that */
      size_t full = Curl_dyn_len(&pp->recvbuf);

      /* trim off the "final" leading part */
      Curl_dyn_tail(&pp->recvbuf, full -  pp->nfinal);

      pp->nfinal = 0; /* now gone */
    }
    if(!pp->overflow) {
      result = pingpong_read(data, sockindex, buffer, sizeof(buffer),
                             &gotbytes);
      if(result == CURLE_AGAIN)
        return CURLE_OK;

      if(result)
        return result;

      if(gotbytes <= 0) {
        failf(data, "response reading failed (errno: %d)", SOCKERRNO);
        return CURLE_RECV_ERROR;
      }

      result = Curl_dyn_addn(&pp->recvbuf, buffer, gotbytes);
      if(result)
        return result;

      data->req.headerbytecount += (unsigned int)gotbytes;

      pp->nread_resp += gotbytes;
    }

    do {
      char *line = Curl_dyn_ptr(&pp->recvbuf);
      char *nl = memchr(line, '\n', Curl_dyn_len(&pp->recvbuf));
      if(nl) {
        /* a newline is CRLF in pp-talk, so the CR is ignored as
           the line is not really terminated until the LF comes */
        size_t length = nl - line + 1;

        /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
        if(!conn->sec_complete)
#endif
          Curl_debug(data, CURLINFO_HEADER_IN, line, length);

        /*
         * Pass all response-lines to the callback function registered for
         * "headers". The response lines can be seen as a kind of headers.
         */
        result = Curl_client_write(data, CLIENTWRITE_INFO, line, length);
        if(result)
          return result;

        if(pp->endofresp(data, conn, line, length, code)) {
          /* When at "end of response", keep the endofresp line first in the
             buffer since it will be accessed outside (by pingpong
             parsers). Store the overflow counter to inform about additional
             data in this buffer after the endofresp line. */
          pp->nfinal = length;
          if(Curl_dyn_len(&pp->recvbuf) > length)
            pp->overflow = Curl_dyn_len(&pp->recvbuf) - length;
          else
            pp->overflow = 0;
          *size = pp->nread_resp; /* size of the response */
          pp->nread_resp = 0; /* restart */
          gotbytes = 0; /* force break out of outer loop */
          break;
        }
        if(Curl_dyn_len(&pp->recvbuf) > length)
          /* keep the remaining piece */
          Curl_dyn_tail((&pp->recvbuf), Curl_dyn_len(&pp->recvbuf) - length);
        else
          Curl_dyn_reset(&pp->recvbuf);
      }
      else {
        /* without a newline, there is no overflow */
        pp->overflow = 0;
        break;
      }

    } while(1); /* while there is buffer left to scan */

  } while(gotbytes == sizeof(buffer));

  pp->pending_resp = FALSE;

  return result;
}